

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcTypeObject::~IfcTypeObject(IfcTypeObject *this)

{
  ~IfcTypeObject((IfcTypeObject *)(&this->field_0x0 + *(long *)(*(long *)this + -0x18)));
  return;
}

Assistant:

IfcTypeObject() : Object("IfcTypeObject") {}